

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kdasm.c
# Opt level: O1

void d68000_movem_re_32(void)

{
  uint uVar1;
  uint uVar2;
  size_t sVar3;
  char *pcVar4;
  int iVar5;
  uint in_EDI;
  uint uVar6;
  uint uVar7;
  char buffer [40];
  char local_58 [40];
  
  uVar1 = dasm_read_imm_16(in_EDI);
  local_58[0] = '\0';
  uVar7 = 0;
  do {
    uVar6 = uVar7;
    if ((uVar1 >> (uVar7 & 0x1f) & 1) != 0) {
      iVar5 = 0;
      if (uVar7 != 7) {
        uVar2 = 6;
        if (6 < uVar7) {
          uVar2 = uVar7;
        }
        iVar5 = 0;
        do {
          uVar6 = uVar7 + iVar5;
          if ((uVar1 >> ((byte)(uVar7 + iVar5) & 0x1f) & 2) == 0) break;
          iVar5 = iVar5 + 1;
          uVar6 = uVar2 + 1;
        } while (~uVar2 + uVar7 + iVar5 != 0);
      }
      if (local_58[0] != '\0') {
        sVar3 = strlen(local_58);
        (local_58 + sVar3)[0] = '/';
        (local_58 + sVar3)[1] = '\0';
      }
      sVar3 = strlen(local_58);
      sprintf(local_58 + sVar3,"D%d",(ulong)uVar7);
      if (iVar5 != 0) {
        sVar3 = strlen(local_58);
        sprintf(local_58 + sVar3,"-D%d",(ulong)(iVar5 + uVar7));
      }
    }
    uVar7 = uVar6 + 1;
  } while (uVar7 < 8);
  uVar7 = 0;
  do {
    uVar6 = uVar7;
    if (((uVar1 >> ((byte)uVar7 & 0x1f)) >> 8 & 1) != 0) {
      iVar5 = 0;
      if (uVar7 != 7) {
        uVar2 = 6;
        if (6 < uVar7) {
          uVar2 = uVar7;
        }
        iVar5 = 0;
        do {
          uVar6 = uVar7 + iVar5;
          if (((uVar1 >> ((byte)(uVar7 + iVar5) & 0x1f)) >> 9 & 1) == 0) break;
          iVar5 = iVar5 + 1;
          uVar6 = uVar2 + 1;
        } while (~uVar2 + uVar7 + iVar5 != 0);
      }
      if (local_58[0] != '\0') {
        sVar3 = strlen(local_58);
        (local_58 + sVar3)[0] = '/';
        (local_58 + sVar3)[1] = '\0';
      }
      sVar3 = strlen(local_58);
      sprintf(local_58 + sVar3,"A%d",(ulong)uVar7);
      if (iVar5 != 0) {
        sVar3 = strlen(local_58);
        sprintf(local_58 + sVar3,"-A%d",(ulong)(iVar5 + uVar7));
      }
    }
    uVar7 = uVar6 + 1;
    if (7 < uVar7) {
      pcVar4 = get_ea_mode_str(g_cpu_ir,2);
      sprintf(g_dasm_str,"movem.l %s, %s",local_58,pcVar4);
      return;
    }
  } while( true );
}

Assistant:

static void d68000_movem_re_32(void)
{
	uint data = read_imm_16();
	char buffer[40];
	uint first;
	uint run_length;
	uint i;

	buffer[0] = 0;
	for(i=0;i<8;i++)
	{
		if(data&(1<<i))
		{
			first = i;
			run_length = 0;
			while(i<7 && (data&(1<<(i+1))))
			{
				i++;
				run_length++;
			}
			if(buffer[0] != 0)
				strcat(buffer, "/");
			sprintf(buffer+strlen(buffer), "D%d", first);
			if(run_length > 0)
				sprintf(buffer+strlen(buffer), "-D%d", first + run_length);
		}
	}
	for(i=0;i<8;i++)
	{
		if(data&(1<<(i+8)))
		{
			first = i;
			run_length = 0;
			while(i<7 && (data&(1<<(i+8+1))))
			{
				i++;
				run_length++;
			}
			if(buffer[0] != 0)
				strcat(buffer, "/");
			sprintf(buffer+strlen(buffer), "A%d", first);
			if(run_length > 0)
				sprintf(buffer+strlen(buffer), "-A%d", first + run_length);
		}
	}
	sprintf(g_dasm_str, "movem.l %s, %s", buffer, get_ea_mode_str_32(g_cpu_ir));
}